

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O3

size_t __thiscall nuraft::timer_helper::get_duration_us(timer_helper *this)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar2 == 0) {
    sVar1 = this->duration_us_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    return sVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

size_t get_duration_us() const {
        std::lock_guard<std::mutex> l(lock_);
        return duration_us_;
    }